

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  int64_t iVar1;
  
  iVar1 = rml_encode_key("hello",0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key("elllo",0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key("hello1",0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_a1 + 6,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_81,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_8b,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_a1,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_ab,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_c1,0x1d);
  printf("code: %lld\n",iVar1);
  iVar1 = rml_encode_key(anon_var_dwarf_cb,0x1d);
  printf("code: %lld\n",iVar1);
  return 0;
}

Assistant:

int main() {
    int64_t prime_number = 29;
    printf("code: %lld\n", rml_encode_key("hello", prime_number));
    printf("code: %lld\n", rml_encode_key("elllo", prime_number));
    printf("code: %lld\n", rml_encode_key("hello1", prime_number));
    printf("code: %lld\n", rml_encode_key("汉字", prime_number));
    printf("code: %lld\n", rml_encode_key("字汉", prime_number));
    printf("code: %lld\n", rml_encode_key("汉字字符", prime_number));
    printf("code: %lld\n", rml_encode_key("字符汉字", prime_number));
    printf("code: %lld\n", rml_encode_key("日本語", prime_number));
    printf("code: %lld\n", rml_encode_key("日語本", prime_number));
    printf("code: %lld\n", rml_encode_key("한국", prime_number));
    return 0;
}